

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

Error __thiscall wave::File::Impl::ReadHeader(Impl *this,HeaderList *headers)

{
  FMTHeader *output;
  DataHeader *output_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  uint64_t uVar5;
  Error EVar6;
  Header data_header;
  string local_118;
  DataHeader *local_f8;
  Header local_f0;
  Header local_c0;
  Header local_90;
  Header local_60;
  
  cVar2 = std::__basic_file<char>::is_open();
  EVar6 = kNotOpen;
  if (cVar2 != '\0') {
    std::istream::seekg((long)this,_S_beg);
    uVar4 = std::istream::tellg();
    EVar6 = kInvalidFormat;
    if (0x2b < uVar4) {
      std::istream::seekg((long)this,_S_beg);
      HeaderList::riff(&local_60,headers);
      ReadHeader<wave::RIFFHeader>(this,&local_60,&(this->header).riff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.id_._M_dataplus._M_p != &local_60.id_.field_2) {
        operator_delete(local_60.id_._M_dataplus._M_p,local_60.id_.field_2._M_allocated_capacity + 1
                       );
      }
      HeaderList::fmt(&local_90,headers);
      output = &(this->header).fmt;
      ReadHeader<wave::FMTHeader>(this,&local_90,output);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.id_._M_dataplus._M_p != &local_90.id_.field_2) {
        operator_delete(local_90.id_._M_dataplus._M_p,local_90.id_.field_2._M_allocated_capacity + 1
                       );
      }
      HeaderList::data(&local_c0,headers);
      output_00 = &(this->header).data;
      ReadHeader<wave::DataHeader>(this,&local_c0,output_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.id_._M_dataplus._M_p != &local_c0.id_.field_2) {
        operator_delete(local_c0.id_._M_dataplus._M_p,local_c0.id_.field_2._M_allocated_capacity + 1
                       );
      }
      HeaderList::data(&local_f0,headers);
      uVar5 = Header::position(&local_f0);
      local_f8 = output_00;
      Header::chunk_id_abi_cxx11_(&local_118,&local_f0);
      paVar1 = &local_118.field_2;
      this->data_offset_ = local_118._M_string_length + uVar5 + 4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT44(local_118.field_2._M_allocated_capacity._4_4_,
                                 local_118.field_2._M_allocated_capacity._0_4_) + 1);
      }
      local_118.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(this->header).riff.chunk_id;
      local_118._M_string_length = 4;
      local_118.field_2._M_allocated_capacity._4_4_ =
           local_118.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
      local_118._M_dataplus._M_p = (pointer)paVar1;
      iVar3 = std::__cxx11::string::compare((char *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT44(local_118.field_2._M_allocated_capacity._4_4_,
                                 local_118.field_2._M_allocated_capacity._0_4_) + 1);
      }
      EVar6 = kInvalidFormat;
      if (iVar3 == 0) {
        local_118.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(this->header).riff.format;
        local_118._M_string_length = 4;
        local_118.field_2._M_allocated_capacity._4_4_ =
             local_118.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
        local_118._M_dataplus._M_p = (pointer)paVar1;
        iVar3 = std::__cxx11::string::compare((char *)&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar1) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT44(local_118.field_2._M_allocated_capacity._4_4_,
                                   local_118.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (iVar3 == 0) {
          local_118.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)output->sub_chunk_1_id;
          local_118._M_string_length = 4;
          local_118.field_2._M_allocated_capacity._4_4_ =
               local_118.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
          local_118._M_dataplus._M_p = (pointer)paVar1;
          iVar3 = std::__cxx11::string::compare((char *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != paVar1) {
            operator_delete(local_118._M_dataplus._M_p,
                            CONCAT44(local_118.field_2._M_allocated_capacity._4_4_,
                                     local_118.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if (iVar3 == 0) {
            local_118.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)local_f8->sub_chunk_2_id;
            local_118._M_string_length = 4;
            local_118.field_2._M_allocated_capacity._4_4_ =
                 local_118.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            local_118._M_dataplus._M_p = (pointer)paVar1;
            iVar3 = std::__cxx11::string::compare((char *)&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar1) {
              operator_delete(local_118._M_dataplus._M_p,
                              CONCAT44(local_118.field_2._M_allocated_capacity._4_4_,
                                       local_118.field_2._M_allocated_capacity._0_4_) + 1);
            }
            if (((iVar3 == 0) && (uVar4 = (ulong)(this->header).fmt.bits_per_sample, uVar4 < 0x21))
               && ((0x100010100U >> (uVar4 & 0x3f) & 1) != 0)) {
              EVar6 = (uint)((this->header).fmt.audio_format != 1) * 3;
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.id_._M_dataplus._M_p != &local_f0.id_.field_2) {
        operator_delete(local_f0.id_._M_dataplus._M_p,local_f0.id_.field_2._M_allocated_capacity + 1
                       );
      }
    }
  }
  return EVar6;
}

Assistant:

Error ReadHeader(HeaderList* headers) {
    if (!istream.is_open()) {
      return kNotOpen;
    }
    istream.seekg(0, std::ios::end);
    auto file_size = istream.tellg();
    // If not enough data
    if (file_size < sizeof(WAVEHeader)) {
      return kInvalidFormat;
    }
    istream.seekg(0, std::ios::beg);
    
    // read headers
    ReadHeader(headers->riff(), &header.riff);
    ReadHeader(headers->fmt(), &header.fmt);
    ReadHeader(headers->data(), &header.data);
    // data offset is right after data header's ID and size
    auto data_header = headers->data();
    data_offset_ = data_header.position() + sizeof(data_header.chunk_size()) + (data_header.chunk_id().size() * sizeof(char));

    // check headers ids (make sure they are set)
    if (std::string(header.riff.chunk_id, 4) != "RIFF") {
      return kInvalidFormat;
    }
    if (std::string(header.riff.format, 4) != "WAVE") {
      return kInvalidFormat;
    }
    if (std::string(header.fmt.sub_chunk_1_id, 4) != "fmt ") {
      return kInvalidFormat;
    }
    if (std::string(header.data.sub_chunk_2_id, 4) != "data") {
      return kInvalidFormat;
    }

    // we only support 8 / 16 / 32  bit per sample
    auto bps = header.fmt.bits_per_sample;
    if (bps != 8 && bps != 16 && bps != 32) {
      return kInvalidFormat;
    }
    
    // And only support uncompressed PCM format
    if (header.fmt.audio_format != Format::WAVE_FORMAT_PCM) {
      return kInvalidFormat;
    }
    
    return kNoError;
  }